

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O0

void visit_flow_ternary_stmt(gvisitor_t *self,gnode_flow_stmt_t *node)

{
  long *plVar1;
  ircode_t *code_00;
  uint32_t uVar2;
  uint32_t p1;
  uint32_t uVar3;
  uint32_t local_84;
  uint32_t local_74;
  uint32_t local_64;
  uint32_t local_54;
  uint32_t label_final;
  uint32_t label_false;
  uint32_t reg;
  ircode_t *code;
  gravity_function_t *context_function;
  gravity_object_t *context_object;
  gnode_flow_stmt_t *node_local;
  gvisitor_t *self_local;
  
  plVar1 = *(long **)(*(long *)((long)self->data + 0x10) + (*self->data + -1) * 8);
  if ((plVar1 == (long *)0x0) || ((gravity_class_t *)*plVar1 != gravity_class_function)) {
    report_error(self,&node->base,"Invalid code context.");
  }
  else {
    code_00 = (ircode_t *)plVar1[0x14];
    uVar2 = ircode_newlabel(code_00);
    p1 = ircode_newlabel(code_00);
    gvisit(self,node->cond);
    uVar3 = ircode_register_pop(code_00);
    if (uVar3 == 0xffffffff) {
      report_error(self,&node->base,"Invalid ternary condition expression.");
    }
    if (node == (gnode_flow_stmt_t *)0x0) {
      local_54 = 0;
    }
    else {
      local_54 = (node->base).token.lineno;
    }
    ircode_add(code_00,JUMPF,uVar3,uVar2,0,local_54);
    gvisit(self,node->stmt);
    uVar3 = ircode_register_pop(code_00);
    if (uVar3 == 0xffffffff) {
      report_error(self,&node->base,"Invalid ternary left stmt expression.");
    }
    if (node == (gnode_flow_stmt_t *)0x0) {
      local_64 = 0;
    }
    else {
      local_64 = (node->base).token.lineno;
    }
    ircode_add(code_00,JUMP,p1,0,0,local_64);
    if (node == (gnode_flow_stmt_t *)0x0) {
      local_74 = 0;
    }
    else {
      local_74 = (node->base).token.lineno;
    }
    ircode_marklabel(code_00,uVar2,local_74);
    gvisit(self,node->elsestmt);
    uVar2 = ircode_register_last(code_00);
    if (uVar2 == 0xffffffff) {
      report_error(self,&node->base,"Invalid ternary right stmt expression.");
    }
    if (node == (gnode_flow_stmt_t *)0x0) {
      local_84 = 0;
    }
    else {
      local_84 = (node->base).token.lineno;
    }
    ircode_marklabel(code_00,p1,local_84);
  }
  return;
}

Assistant:

static void visit_flow_ternary_stmt (gvisitor_t *self, gnode_flow_stmt_t *node) {
    DEBUG_CODEGEN("visit_flow_ternary_stmt");
    DECLARE_CODE();

    uint32_t reg;
    uint32_t label_false = ircode_newlabel(code);
    uint32_t label_final = ircode_newlabel(code);

    visit(node->cond);
    reg = ircode_register_pop(code);
    if (reg == REGISTER_ERROR) report_error(self, (gnode_t *)node, "Invalid ternary condition expression.");
    ircode_add(code, JUMPF, reg, label_false, 0, LINE_NUMBER(node));

    visit(node->stmt);
    reg = ircode_register_pop(code);
    if (reg == REGISTER_ERROR) report_error(self, (gnode_t *)node, "Invalid ternary left stmt expression.");
    ircode_add(code, JUMP, label_final, 0, 0, LINE_NUMBER(node));

    ircode_marklabel(code, label_false, LINE_NUMBER(node));
    visit(node->elsestmt);
    reg = ircode_register_last(code);
    if (reg == REGISTER_ERROR) report_error(self, (gnode_t *)node, "Invalid ternary right stmt expression.");
    ircode_marklabel(code, label_final, LINE_NUMBER(node));

    return;
}